

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::ping_observer::ping_observer
          (ping_observer *this,shared_ptr<libtorrent::dht::traversal_algorithm> *algorithm,
          endpoint *ep,node_id *id)

{
  shared_ptr<libtorrent::dht::traversal_algorithm> local_38;
  node_id *local_28;
  node_id *id_local;
  endpoint *ep_local;
  shared_ptr<libtorrent::dht::traversal_algorithm> *algorithm_local;
  ping_observer *this_local;
  
  local_28 = id;
  id_local = (node_id *)ep;
  ep_local = (endpoint *)algorithm;
  algorithm_local = (shared_ptr<libtorrent::dht::traversal_algorithm> *)this;
  ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::shared_ptr(&local_38,algorithm);
  observer::observer(&this->super_observer,&local_38,(endpoint *)id_local,local_28);
  ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::~shared_ptr(&local_38);
  (this->super_observer)._vptr_observer = (_func_int **)&PTR__ping_observer_00b968f0;
  return;
}

Assistant:

ping_observer(
		std::shared_ptr<traversal_algorithm> algorithm
		, udp::endpoint const& ep, node_id const& id)
		: observer(std::move(algorithm), ep, id)
	{}